

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_copy_var_nentry_test(btree_kv_ops *kv_ops)

{
  char *pcVar1;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var2;
  void *pvVar3;
  _func_void_bnode_ptr_bnode_ptr_idx_t_idx_t_idx_t *p_Var4;
  long lVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  ushort uVar9;
  bnoderef pbVar10;
  int iVar11;
  bnode *pbVar12;
  char *pcVar13;
  ulong uVar14;
  char *pcVar15;
  char acStackY_138 [12];
  uint16_t in_stack_fffffffffffffed4;
  uint8_t in_stack_fffffffffffffed6;
  uint8_t in_stack_fffffffffffffed7;
  char local_128 [72];
  undefined8 uStack_e0;
  char *local_d0;
  char *local_c8;
  uint local_bc;
  char *local_b8;
  char *local_b0;
  uint local_a4;
  char *local_a0;
  char *k_out;
  char **key;
  int local_88;
  uint8_t vsize;
  uint8_t ksize;
  int n;
  ushort local_7c;
  idx_t len;
  idx_t dst_idx;
  idx_t src_idx;
  idx_t idx;
  uint8_t v_out;
  uint8_t v;
  bnoderef node_dst;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  btree_kv_ops *kv_ops_local;
  
  uStack_e0 = 0x103d4c;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  uStack_e0 = 0x103d59;
  memleak_start();
  local_88 = 10;
  key._7_1_ = 8;
  key._6_1_ = 1;
  k_out = local_128;
  local_a0 = acStackY_138;
  node_dst = dummy_node(in_stack_fffffffffffffed7,in_stack_fffffffffffffed6,
                        in_stack_fffffffffffffed4);
  node_dst->nentry = (idx_t)local_88;
  len._1_1_ = 'd';
  pcVar15 = acStackY_138;
  for (local_7c = 0; (int)(uint)local_7c < local_88; local_7c = local_7c + 1) {
    lVar5 = -(ulong)(key._7_1_ + 0xf & 0xfffffff0);
    pcVar13 = pcVar15 + lVar5;
    *(char **)(k_out + (ulong)local_7c * 8) = pcVar13;
    pcVar1 = *(char **)(k_out + (ulong)local_7c * 8);
    uVar14 = (ulong)local_7c;
    builtin_strncpy(pcVar15 + lVar5 + -8,"6>\x10",4);
    pcVar13[-4] = '\0';
    pcVar13[-3] = '\0';
    pcVar13[-2] = '\0';
    pcVar13[-1] = '\0';
    sprintf(pcVar1,"key%d",uVar14);
    pbVar10 = node_dst;
    uVar9 = local_7c;
    p_Var2 = kv_ops->set_kv;
    pvVar3 = *(void **)(k_out + (ulong)local_7c * 8);
    builtin_strncpy(pcVar15 + lVar5 + -8,"^>\x10",4);
    pcVar13[-4] = '\0';
    pcVar13[-3] = '\0';
    pcVar13[-2] = '\0';
    pcVar13[-1] = '\0';
    (*p_Var2)(pbVar10,uVar9,pvVar3,(void *)((long)&len + 1));
    len._1_1_ = len._1_1_ + '\x01';
    pcVar15 = pcVar13;
  }
  n._2_2_ = (idx_t)(local_88 / 2);
  n._0_2_ = 0;
  _vsize = n._2_2_;
  pcVar15[-8] = -0x52;
  pcVar15[-7] = '>';
  pcVar15[-6] = '\x10';
  pcVar15[-5] = '\0';
  pcVar15[-4] = '\0';
  pcVar15[-3] = '\0';
  pcVar15[-2] = '\0';
  pcVar15[-1] = '\0';
  pbVar12 = dummy_node(pcVar15[0xf],pcVar15[0xe],*(uint16_t *)(pcVar15 + 0xc));
  pbVar10 = node_dst;
  iVar8 = n._2_2_;
  iVar6 = (idx_t)n;
  iVar7 = _vsize;
  p_Var4 = kv_ops->copy_kv;
  _dst_idx = pbVar12;
  pcVar15[-8] = -0x29;
  pcVar15[-7] = '>';
  pcVar15[-6] = '\x10';
  pcVar15[-5] = '\0';
  pcVar15[-4] = '\0';
  pcVar15[-3] = '\0';
  pcVar15[-2] = '\0';
  pcVar15[-1] = '\0';
  (*p_Var4)(pbVar12,pbVar10,iVar6,iVar8,iVar7);
  len._1_1_ = (char)(local_88 / 2) + 'd';
  local_7c = 0;
  do {
    pbVar10 = node_dst;
    pbVar12 = _dst_idx;
    uVar9 = local_7c;
    iVar7 = n._2_2_;
    pcVar1 = local_a0;
    local_a4 = (uint)local_7c;
    if (local_88 / 2 <= (int)local_a4) {
      n._0_2_ = n._2_2_;
      n._2_2_ = 0;
      p_Var4 = kv_ops->copy_kv;
      iVar6 = (idx_t)local_88;
      pcVar15[-8] = -0x38;
      pcVar15[-7] = '@';
      pcVar15[-6] = '\x10';
      pcVar15[-5] = '\0';
      pcVar15[-4] = '\0';
      pcVar15[-3] = '\0';
      pcVar15[-2] = '\0';
      pcVar15[-1] = '\0';
      (*p_Var4)(pbVar12,pbVar10,iVar7,0,iVar6);
      len._1_1_ = 'd';
      local_7c = (ushort)(local_88 / 2);
      do {
        pbVar10 = node_dst;
        pbVar12 = _dst_idx;
        uVar9 = local_7c;
        pcVar1 = local_a0;
        local_bc = (uint)local_7c;
        if (local_88 + local_88 / 2 <= (int)local_bc) {
          n._0_2_ = 0;
          n._2_2_ = 0;
          p_Var4 = kv_ops->copy_kv;
          iVar7 = (idx_t)local_88;
          pcVar15[-8] = -0x48;
          pcVar15[-7] = 'B';
          pcVar15[-6] = '\x10';
          pcVar15[-5] = '\0';
          pcVar15[-4] = '\0';
          pcVar15[-3] = '\0';
          pcVar15[-2] = '\0';
          pcVar15[-1] = '\0';
          (*p_Var4)(pbVar12,pbVar10,0,0,iVar7);
          len._1_1_ = 'd';
          local_7c = n._2_2_;
          do {
            pbVar10 = node_dst;
            pbVar12 = _dst_idx;
            uVar9 = local_7c;
            pcVar1 = local_a0;
            if (local_88 <= (int)(uint)local_7c) {
              builtin_strncpy(pcVar15 + -8,"\x15D\x10",4);
              pcVar15[-4] = '\0';
              pcVar15[-3] = '\0';
              pcVar15[-2] = '\0';
              pcVar15[-1] = '\0';
              free(pbVar10);
              pbVar12 = _dst_idx;
              builtin_strncpy(pcVar15 + -8,"\x1eD\x10",4);
              pcVar15[-4] = '\0';
              pcVar15[-3] = '\0';
              pcVar15[-2] = '\0';
              pcVar15[-1] = '\0';
              free(pbVar12);
              builtin_strncpy(pcVar15 + -8,"#D\x10",4);
              pcVar15[-4] = '\0';
              pcVar15[-3] = '\0';
              pcVar15[-2] = '\0';
              pcVar15[-1] = '\0';
              memleak_end();
              if (kv_copy_var_nentry_test::__test_pass == 0) {
                builtin_strncpy(pcVar15 + -8,"lD\x10",4);
                pcVar15[-4] = '\0';
                pcVar15[-3] = '\0';
                pcVar15[-2] = '\0';
                pcVar15[-1] = '\0';
                fprintf(_stderr,"%s FAILED\n","kv_copy_var_nentry_test");
              }
              else {
                builtin_strncpy(pcVar15 + -8,"KD\x10",4);
                pcVar15[-4] = '\0';
                pcVar15[-3] = '\0';
                pcVar15[-2] = '\0';
                pcVar15[-1] = '\0';
                fprintf(_stderr,"%s PASSED\n","kv_copy_var_nentry_test");
              }
              return;
            }
            p_Var2 = kv_ops->get_kv;
            pcVar15[-8] = -0x10;
            pcVar15[-7] = 'B';
            pcVar15[-6] = '\x10';
            pcVar15[-5] = '\0';
            pcVar15[-4] = '\0';
            pcVar15[-3] = '\0';
            pcVar15[-2] = '\0';
            pcVar15[-1] = '\0';
            (*p_Var2)(pbVar12,uVar9,pcVar1,&len);
            pcVar13 = local_a0;
            pcVar1 = *(char **)(k_out + (ulong)local_7c * 8);
            builtin_strncpy(pcVar15 + -8,"\vC\x10",4);
            pcVar15[-4] = '\0';
            pcVar15[-3] = '\0';
            pcVar15[-2] = '\0';
            pcVar15[-1] = '\0';
            iVar11 = strcmp(pcVar13,pcVar1);
            if (iVar11 != 0) {
              builtin_strncpy(pcVar15 + -8,"4C\x10",4);
              pcVar15[-4] = '\0';
              pcVar15[-3] = '\0';
              pcVar15[-2] = '\0';
              pcVar15[-1] = '\0';
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x2a9);
              pcVar13 = local_a0;
              kv_copy_var_nentry_test::__test_pass = 0;
              pcVar1 = *(char **)(k_out + (ulong)local_7c * 8);
              builtin_strncpy(pcVar15 + -8,"YC\x10",4);
              pcVar15[-4] = '\0';
              pcVar15[-3] = '\0';
              pcVar15[-2] = '\0';
              pcVar15[-1] = '\0';
              iVar11 = strcmp(pcVar13,pcVar1);
              if (iVar11 != 0) {
                pcVar15[-8] = -0x78;
                pcVar15[-7] = 'C';
                pcVar15[-6] = '\x10';
                pcVar15[-5] = '\0';
                pcVar15[-4] = '\0';
                pcVar15[-3] = '\0';
                pcVar15[-2] = '\0';
                pcVar15[-1] = '\0';
                __assert_fail("!(strcmp(k_out, key[idx]))",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                              ,0x2a9,"void kv_copy_var_nentry_test(btree_kv_ops *)");
              }
            }
            if ((char)len != len._1_1_) {
              pcVar15[-8] = -0x46;
              pcVar15[-7] = 'C';
              pcVar15[-6] = '\x10';
              pcVar15[-5] = '\0';
              pcVar15[-4] = '\0';
              pcVar15[-3] = '\0';
              pcVar15[-2] = '\0';
              pcVar15[-1] = '\0';
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x2aa);
              kv_copy_var_nentry_test::__test_pass = 0;
              if ((char)len != len._1_1_) {
                pcVar15[-8] = -0xf;
                pcVar15[-7] = 'C';
                pcVar15[-6] = '\x10';
                pcVar15[-5] = '\0';
                pcVar15[-4] = '\0';
                pcVar15[-3] = '\0';
                pcVar15[-2] = '\0';
                pcVar15[-1] = '\0';
                __assert_fail("v_out == v",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                              ,0x2aa,"void kv_copy_var_nentry_test(btree_kv_ops *)");
              }
            }
            len._1_1_ = len._1_1_ + '\x01';
            local_7c = local_7c + 1;
          } while( true );
        }
        p_Var2 = kv_ops->get_kv;
        builtin_strncpy(pcVar15 + -8,"$A\x10",4);
        pcVar15[-4] = '\0';
        pcVar15[-3] = '\0';
        pcVar15[-2] = '\0';
        pcVar15[-1] = '\0';
        (*p_Var2)(pbVar12,uVar9,pcVar1,&len);
        pcVar13 = local_a0;
        local_c8 = k_out;
        pcVar1 = *(char **)(k_out + (long)(int)((uint)local_7c - local_88 / 2) * 8);
        builtin_strncpy(pcVar15 + -8,"_A\x10",4);
        pcVar15[-4] = '\0';
        pcVar15[-3] = '\0';
        pcVar15[-2] = '\0';
        pcVar15[-1] = '\0';
        iVar11 = strcmp(pcVar13,pcVar1);
        if (iVar11 != 0) {
          pcVar15[-8] = -0x74;
          pcVar15[-7] = 'A';
          pcVar15[-6] = '\x10';
          pcVar15[-5] = '\0';
          pcVar15[-4] = '\0';
          pcVar15[-3] = '\0';
          pcVar15[-2] = '\0';
          pcVar15[-1] = '\0';
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x29a);
          pcVar13 = local_a0;
          kv_copy_var_nentry_test::__test_pass = 0;
          local_d0 = k_out;
          pcVar1 = *(char **)(k_out + (long)(int)((uint)local_7c - local_88 / 2) * 8);
          pcVar15[-8] = -0x2f;
          pcVar15[-7] = 'A';
          pcVar15[-6] = '\x10';
          pcVar15[-5] = '\0';
          pcVar15[-4] = '\0';
          pcVar15[-3] = '\0';
          pcVar15[-2] = '\0';
          pcVar15[-1] = '\0';
          iVar11 = strcmp(pcVar13,pcVar1);
          if (iVar11 != 0) {
            pcVar15[-8] = '\0';
            pcVar15[-7] = 'B';
            pcVar15[-6] = '\x10';
            pcVar15[-5] = '\0';
            pcVar15[-4] = '\0';
            pcVar15[-3] = '\0';
            pcVar15[-2] = '\0';
            pcVar15[-1] = '\0';
            __assert_fail("!(strcmp(k_out, key[idx - n/2]))",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                          ,0x29a,"void kv_copy_var_nentry_test(btree_kv_ops *)");
          }
        }
        if ((char)len != len._1_1_) {
          builtin_strncpy(pcVar15 + -8,"2B\x10",4);
          pcVar15[-4] = '\0';
          pcVar15[-3] = '\0';
          pcVar15[-2] = '\0';
          pcVar15[-1] = '\0';
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                  ,0x29b);
          kv_copy_var_nentry_test::__test_pass = 0;
          if ((char)len != len._1_1_) {
            builtin_strncpy(pcVar15 + -8,"iB\x10",4);
            pcVar15[-4] = '\0';
            pcVar15[-3] = '\0';
            pcVar15[-2] = '\0';
            pcVar15[-1] = '\0';
            __assert_fail("v_out == v",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                          ,0x29b,"void kv_copy_var_nentry_test(btree_kv_ops *)");
          }
        }
        len._1_1_ = len._1_1_ + '\x01';
        local_7c = local_7c + 1;
      } while( true );
    }
    p_Var2 = kv_ops->get_kv;
    builtin_strncpy(pcVar15 + -8,"2?\x10",4);
    pcVar15[-4] = '\0';
    pcVar15[-3] = '\0';
    pcVar15[-2] = '\0';
    pcVar15[-1] = '\0';
    (*p_Var2)(pbVar12,uVar9,pcVar1,&len);
    pcVar13 = local_a0;
    local_b0 = k_out;
    pcVar1 = *(char **)(k_out + (long)(int)((uint)local_7c + local_88 / 2) * 8);
    builtin_strncpy(pcVar15 + -8,"m?\x10",4);
    pcVar15[-4] = '\0';
    pcVar15[-3] = '\0';
    pcVar15[-2] = '\0';
    pcVar15[-1] = '\0';
    iVar11 = strcmp(pcVar13,pcVar1);
    if (iVar11 != 0) {
      pcVar15[-8] = -0x66;
      pcVar15[-7] = '?';
      pcVar15[-6] = '\x10';
      pcVar15[-5] = '\0';
      pcVar15[-4] = '\0';
      pcVar15[-3] = '\0';
      pcVar15[-2] = '\0';
      pcVar15[-1] = '\0';
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0x28a);
      pcVar13 = local_a0;
      kv_copy_var_nentry_test::__test_pass = 0;
      local_b8 = k_out;
      pcVar1 = *(char **)(k_out + (long)(int)((uint)local_7c + local_88 / 2) * 8);
      pcVar15[-8] = -0x21;
      pcVar15[-7] = '?';
      pcVar15[-6] = '\x10';
      pcVar15[-5] = '\0';
      pcVar15[-4] = '\0';
      pcVar15[-3] = '\0';
      pcVar15[-2] = '\0';
      pcVar15[-1] = '\0';
      iVar11 = strcmp(pcVar13,pcVar1);
      if (iVar11 != 0) {
        builtin_strncpy(pcVar15 + -8,"\x0e@\x10",4);
        pcVar15[-4] = '\0';
        pcVar15[-3] = '\0';
        pcVar15[-2] = '\0';
        pcVar15[-1] = '\0';
        __assert_fail("!(strcmp(k_out, key[idx + n/2]))",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x28a,"void kv_copy_var_nentry_test(btree_kv_ops *)");
      }
    }
    if ((char)len != len._1_1_) {
      builtin_strncpy(pcVar15 + -8,"@@\x10",4);
      pcVar15[-4] = '\0';
      pcVar15[-3] = '\0';
      pcVar15[-2] = '\0';
      pcVar15[-1] = '\0';
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
              ,0x28b);
      kv_copy_var_nentry_test::__test_pass = 0;
      if ((char)len != len._1_1_) {
        builtin_strncpy(pcVar15 + -8,"w@\x10",4);
        pcVar15[-4] = '\0';
        pcVar15[-3] = '\0';
        pcVar15[-2] = '\0';
        pcVar15[-1] = '\0';
        __assert_fail("v_out == v",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                      ,0x28b,"void kv_copy_var_nentry_test(btree_kv_ops *)");
      }
    }
    len._1_1_ = len._1_1_ + '\x01';
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

void kv_copy_var_nentry_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node, node_dst;
    uint8_t v, v_out;
    idx_t idx, src_idx, dst_idx, len;
    int n=10;
    uint8_t ksize = 8;
    uint8_t vsize = sizeof(v);
    char **key = alca(char*, n);
    char *k_out = alca(char, ksize);

    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    // set n items into source node
    for (idx = 0; idx < n; idx++){
        key[idx] = alca(char, ksize);
        sprintf(key[idx], "key%d", idx);
        kv_ops->set_kv(node, idx, key[idx], (void *)&v);
        v++;
    }

    // copy n/2 entries into dest node
    src_idx = n/2;
    dst_idx = 0;
    len = src_idx;
    node_dst = dummy_node(ksize, vsize, 1);
    kv_ops->copy_kv(node_dst, node, dst_idx, src_idx, len);

    // verify
    v = 100 + n/2;
    for (idx = 0; idx < n/2; idx++){

        kv_ops->get_kv(node_dst, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx + n/2])));
        TEST_CHK(v_out == v);
        v++;

    }

    // append n entries into dst node
    dst_idx = src_idx;
    src_idx = 0;
    kv_ops->copy_kv(node_dst, node, dst_idx, src_idx, n);

    // verify
    v = 100;
    for (idx = n/2; idx < n+n/2; idx++){

        kv_ops->get_kv(node_dst, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx - n/2])));
        TEST_CHK(v_out == v);
        v++;
    }

    // prepend n entries into dst node
    dst_idx = 0;
    src_idx = 0;
    kv_ops->copy_kv(node_dst, node, dst_idx, src_idx, n);

    // verify
    v = 100;
    for (idx = src_idx; idx < n; idx++){

        kv_ops->get_kv(node_dst, idx, k_out, (void *)&v_out);
        TEST_CHK(!(strcmp(k_out, key[idx])));
        TEST_CHK(v_out == v);
        v++;
    }

    free(node); free(node_dst);

    memleak_end();
    TEST_RESULT("kv_copy_var_nentry_test");
}